

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Platform.cpp
# Opt level: O1

uint8_t __thiscall
GmmLib::PlatformInfoGen11::ValidateUnifiedAuxSurface(PlatformInfoGen11 *this,GMM_TEXTURE_INFO *Surf)

{
  uint uVar1;
  anon_struct_8_45_9b07292e_for_Gpu aVar2;
  uint8_t uVar3;
  
  aVar2 = (Surf->Flags).Gpu;
  if (((((ulong)aVar2 >> 0x25 & 1) == 0) ||
      (((uVar1 = (Surf->MSAA).NumSamples, ((ulong)aVar2 & 0x400800000) != 0 &&
        (((ulong)aVar2 & 2) != 0)) && (uVar1 < 2)))) ||
     (((((this->super_PlatformInfoGen10).super_PlatformInfo.pGmmLibContext)->pPlatformInfo->Data).
       Platform.eProductFamily == IGFX_LAKEFIELD && ((aVar2._2_1_ & uVar1 < 2) == 1)))) {
    uVar3 = '\x01';
  }
  else {
    uVar3 = '\0';
  }
  return uVar3;
}

Assistant:

uint8_t GmmLib::PlatformInfoGen11::ValidateUnifiedAuxSurface(GMM_TEXTURE_INFO &Surf)
{
    if((Surf.Flags.Gpu.UnifiedAuxSurface) &&
       !( //--- Legitimate UnifiedAuxSurface Case ------------------------------------------
       Surf.Flags.Gpu.CCS &&
       ((Surf.MSAA.NumSamples <= 1 && (Surf.Flags.Gpu.RenderTarget || Surf.Flags.Gpu.Texture))) ||
       ((GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_LAKEFIELD) && Surf.Flags.Gpu.MMC &&
        (Surf.MSAA.NumSamples <= 1))))
    {
        GMM_ASSERTDPF(0, "Invalid UnifiedAuxSurface usage!");
        return 0;
    }
    return 1;
}